

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = secp256k1_scalar_is_zero(a);
  uVar4 = -(ulong)(uVar3 ^ 1);
  uVar1 = a->d[0];
  r->d[0] = ~uVar1 + 0xbfd25e8cd0364142 & uVar4;
  uVar1 = (ulong)(0x402da1732fc9bebd < ~uVar1);
  uVar5 = ~a->d[1] + uVar1;
  uVar6 = (ulong)CARRY8(~a->d[1],uVar1);
  r->d[1] = uVar5 + 0xbaaedce6af48a03b & uVar4;
  uVar1 = a->d[2];
  uVar5 = (ulong)(0x4551231950b75fc4 < uVar5);
  uVar2 = ~uVar1 + uVar6;
  uVar7 = uVar2 + uVar5;
  r->d[2] = uVar7 - 2 & uVar4;
  r->d[3] = (~a->d[3] + (ulong)(CARRY8(~uVar1,uVar6) || CARRY8(uVar2,uVar5)) + (ulong)(1 < uVar7)) -
            1 & uVar4;
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    uint64_t nonzero = 0xFFFFFFFFFFFFFFFFULL * (secp256k1_scalar_is_zero(a) == 0);
    uint128_t t = (uint128_t)(~a->d[0]) + SECP256K1_N_0 + 1;
    r->d[0] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[1]) + SECP256K1_N_1;
    r->d[1] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[2]) + SECP256K1_N_2;
    r->d[2] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[3]) + SECP256K1_N_3;
    r->d[3] = t & nonzero;
}